

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O0

exr_result_t default_compress_chunk(exr_encode_pipeline_t *encode)

{
  _func_exr_result_t__internal_exr_context_ptr_exr_result_t_char_ptr_varargs *p_Var1;
  exr_result_t eVar2;
  size_t sVar3;
  size_t *cursz;
  long in_RDI;
  _internal_exr_part *part;
  _internal_exr_context *pctxt;
  exr_result_t rv;
  exr_encode_pipeline_t *in_stack_00000068;
  exr_encode_pipeline_t *in_stack_00000070;
  exr_encode_pipeline_t *in_stack_ffffffffffffff98;
  exr_encode_pipeline_t *in_stack_ffffffffffffffa8;
  _internal_exr_context *c;
  _internal_exr_part *buf;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  exr_result_t local_4;
  
  c = *(_internal_exr_context **)(in_RDI + 0x10);
  if (c == (_internal_exr_context *)0x0) {
    local_4 = 2;
  }
  else if ((*(int *)(in_RDI + 0xc) < 0) || (c->num_parts <= *(int *)(in_RDI + 0xc))) {
    if (c->mode == '\x01') {
      internal_exr_unlock(c);
    }
    local_4 = (*c->print_error)(c,4,"Part index (%d) out of range",(ulong)*(uint *)(in_RDI + 0xc));
  }
  else {
    buf = c->parts[*(int *)(in_RDI + 0xc)];
    sVar3 = in_RDI + 0xa0;
    cursz = (size_t *)(in_RDI + 0xb0);
    exr_compress_max_buffer_size((size_t)in_stack_ffffffffffffffa8);
    eVar2 = internal_encode_alloc_buffer
                      ((exr_encode_pipeline_t *)
                       CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                       (exr_transcoding_pipeline_buffer_id_t)((ulong)c >> 0x20),(void **)buf,cursz,
                       sVar3);
    if (eVar2 == 0) {
      switch(buf->comp_type) {
      case EXR_COMPRESSION_NONE:
        local_4 = (*c->report_error)(c,3,"no compression set but still trying to compress");
        break;
      case EXR_COMPRESSION_RLE:
        local_4 = internal_exr_apply_rle(in_stack_ffffffffffffffa8);
        break;
      case EXR_COMPRESSION_ZIPS:
      case EXR_COMPRESSION_ZIP:
        local_4 = internal_exr_apply_zip(in_stack_ffffffffffffffa8);
        break;
      case EXR_COMPRESSION_PIZ:
        local_4 = internal_exr_apply_piz(in_stack_00000068);
        break;
      case EXR_COMPRESSION_PXR24:
        local_4 = internal_exr_apply_pxr24(in_stack_ffffffffffffff98);
        break;
      case EXR_COMPRESSION_B44:
        local_4 = internal_exr_apply_b44((exr_encode_pipeline_t *)0x14f169);
        break;
      case EXR_COMPRESSION_B44A:
        local_4 = internal_exr_apply_b44a((exr_encode_pipeline_t *)0x14f179);
        break;
      case EXR_COMPRESSION_DWAA:
        local_4 = internal_exr_apply_dwaa(in_stack_00000070);
        break;
      case EXR_COMPRESSION_DWAB:
        local_4 = internal_exr_apply_dwab(in_stack_00000070);
        break;
      case EXR_COMPRESSION_LAST_TYPE:
      default:
        local_4 = (*c->print_error)(c,3,"Compression technique 0x%02X invalid",(ulong)buf->comp_type
                                   );
      }
    }
    else {
      p_Var1 = c->print_error;
      sVar3 = exr_compress_max_buffer_size((size_t)c);
      local_4 = (*p_Var1)(c,eVar2,"error allocating buffer %lu",sVar3);
    }
  }
  return local_4;
}

Assistant:

OPENEXR_CORE_INTERNAL_NAMESPACE_SOURCE_ENTER

/**************************************/

static exr_result_t
default_compress_chunk (exr_encode_pipeline_t* encode)
{
    exr_result_t rv;
    EXR_PROMOTE_CONST_CONTEXT_AND_PART_OR_ERROR_NO_LOCK (
        encode->context, encode->part_index);

    rv = internal_encode_alloc_buffer (
        encode,
        EXR_TRANSCODE_BUFFER_COMPRESSED,
        &(encode->compressed_buffer),
        &(encode->compressed_alloc_size),
        exr_compress_max_buffer_size( encode->packed_bytes ));
    if (rv != EXR_ERR_SUCCESS)
        return pctxt->print_error (
            pctxt,
            rv,
            "error allocating buffer %lu",
            exr_compress_max_buffer_size (encode->packed_bytes));
    //return rv;

    switch (part->comp_type)
    {
        case EXR_COMPRESSION_NONE:
            return pctxt->report_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "no compression set but still trying to compress");

        case EXR_COMPRESSION_RLE: rv = internal_exr_apply_rle (encode); break;
        case EXR_COMPRESSION_ZIP:
        case EXR_COMPRESSION_ZIPS: rv = internal_exr_apply_zip (encode); break;
        case EXR_COMPRESSION_PIZ: rv = internal_exr_apply_piz (encode); break;
        case EXR_COMPRESSION_PXR24:
            rv = internal_exr_apply_pxr24 (encode);
            break;
        case EXR_COMPRESSION_B44: rv = internal_exr_apply_b44 (encode); break;
        case EXR_COMPRESSION_B44A: rv = internal_exr_apply_b44a (encode); break;
        case EXR_COMPRESSION_DWAA: rv = internal_exr_apply_dwaa (encode); break;
        case EXR_COMPRESSION_DWAB: rv = internal_exr_apply_dwab (encode); break;
        case EXR_COMPRESSION_LAST_TYPE:
        default:
            return pctxt->print_error (
                pctxt,
                EXR_ERR_INVALID_ARGUMENT,
                "Compression technique 0x%02X invalid",
                (int) part->comp_type);
    }
    return rv;
}